

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O2

bool __thiscall
lzham::prefix_coding::decoder_tables::assign(decoder_tables *this,decoder_tables *rhs)

{
  uint uVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  bool bVar4;
  uint16 *__src;
  
  bVar4 = true;
  if (this == rhs) {
    return true;
  }
  if (this->m_malloc_context != rhs->m_malloc_context) {
    clear(this);
    this->m_malloc_context = rhs->m_malloc_context;
  }
  puVar2 = this->m_lookup;
  puVar3 = this->m_sorted_symbol_order;
  memcpy(this,rhs,200);
  if (((puVar3 == (unsigned_short *)0x0 || puVar2 == (uint *)0x0) ||
      (uVar1 = rhs->m_cur_lookup_size, uVar1 != this->m_cur_lookup_size)) ||
     (rhs->m_cur_sorted_symbol_order_size != this->m_cur_sorted_symbol_order_size)) {
    lzham_delete_array<unsigned_int>(this->m_malloc_context,puVar2);
    this->m_lookup = (uint32 *)0x0;
    if (rhs->m_lookup == (uint32 *)0x0) {
LAB_0011628f:
      lzham_delete_array<unsigned_short>(this->m_malloc_context,puVar3);
      this->m_sorted_symbol_order = (uint16 *)0x0;
      if (rhs->m_sorted_symbol_order == (uint16 *)0x0) {
        return true;
      }
      puVar3 = lzham_new_array<unsigned_short>
                         (this->m_malloc_context,this->m_cur_sorted_symbol_order_size);
      this->m_sorted_symbol_order = puVar3;
      if (puVar3 != (unsigned_short *)0x0) {
        __src = rhs->m_sorted_symbol_order;
        uVar1 = this->m_cur_sorted_symbol_order_size;
        goto LAB_001162db;
      }
    }
    else {
      puVar2 = lzham_new_array<unsigned_int>(this->m_malloc_context,this->m_cur_lookup_size);
      this->m_lookup = puVar2;
      if (puVar2 != (uint *)0x0) {
        memcpy(puVar2,rhs->m_lookup,(ulong)this->m_cur_lookup_size << 2);
        goto LAB_0011628f;
      }
    }
    bVar4 = false;
  }
  else {
    this->m_lookup = puVar2;
    this->m_sorted_symbol_order = puVar3;
    memcpy(puVar2,rhs->m_lookup,(ulong)uVar1 << 2);
    puVar3 = this->m_sorted_symbol_order;
    __src = rhs->m_sorted_symbol_order;
    uVar1 = this->m_cur_sorted_symbol_order_size;
LAB_001162db:
    memcpy(puVar3,__src,(ulong)uVar1 * 2);
  }
  return bVar4;
}

Assistant:

inline bool assign(const decoder_tables& rhs)
         {
            if (this == &rhs)
               return true;

            if (m_malloc_context != rhs.m_malloc_context)
            {
               clear();

               m_malloc_context = rhs.m_malloc_context;
            }

            uint32* pCur_lookup = m_lookup;
            uint16* pCur_sorted_symbol_order = m_sorted_symbol_order;

            memcpy(this, &rhs, sizeof(*this));

            if ((pCur_lookup) && (pCur_sorted_symbol_order) && (rhs.m_cur_lookup_size == m_cur_lookup_size) && (rhs.m_cur_sorted_symbol_order_size == m_cur_sorted_symbol_order_size))
            {
               m_lookup = pCur_lookup;
               m_sorted_symbol_order = pCur_sorted_symbol_order;

               memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }
            else
            {
               lzham_delete_array(m_malloc_context, pCur_lookup);
               m_lookup = NULL;

               if (rhs.m_lookup)
               {
                  m_lookup = lzham_new_array<uint32>(m_malloc_context, m_cur_lookup_size);
                  if (!m_lookup)
                     return false;
                  memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               }

               lzham_delete_array(m_malloc_context, pCur_sorted_symbol_order);
               m_sorted_symbol_order = NULL;

               if (rhs.m_sorted_symbol_order)
               {
                  m_sorted_symbol_order = lzham_new_array<uint16>(m_malloc_context, m_cur_sorted_symbol_order_size);
                  if (!m_sorted_symbol_order)
                     return false;
                  memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
               }
            }

            return true;
         }